

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.h
# Opt level: O2

void __thiscall
lzham::quasi_adaptive_huffman_data_model::set_malloc_context
          (quasi_adaptive_huffman_data_model *this,lzham_malloc_context malloc_context)

{
  this->m_malloc_context = malloc_context;
  vector<unsigned_short>::clear(&this->m_initial_sym_freq);
  (this->m_initial_sym_freq).m_malloc_context = malloc_context;
  vector<unsigned_short>::clear(&this->m_sym_freq);
  (this->m_sym_freq).m_malloc_context = malloc_context;
  vector<unsigned_short>::clear(&this->m_codes);
  (this->m_codes).m_malloc_context = malloc_context;
  vector<unsigned_char>::clear(&this->m_code_sizes);
  (this->m_code_sizes).m_malloc_context = malloc_context;
  return;
}

Assistant:

void set_malloc_context(lzham_malloc_context malloc_context) 
      { 
         m_malloc_context = malloc_context; 
         m_initial_sym_freq.set_malloc_context(malloc_context);
         m_sym_freq.set_malloc_context(malloc_context);
         m_codes.set_malloc_context(malloc_context);
         m_code_sizes.set_malloc_context(malloc_context);
      }